

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

ALLEGRO_EVENT * get_next_event_if_any(ALLEGRO_EVENT_QUEUE *queue,_Bool delete)

{
  _Bool _Var1;
  uint uVar2;
  byte in_SIL;
  ALLEGRO_EVENT_QUEUE *in_RDI;
  ALLEGRO_EVENT *event;
  uint in_stack_ffffffffffffffdc;
  ALLEGRO_EVENT *local_8;
  
  _Var1 = is_event_queue_empty(in_RDI);
  if (_Var1) {
    local_8 = (ALLEGRO_EVENT *)0x0;
  }
  else {
    local_8 = (ALLEGRO_EVENT *)_al_vector_ref(&in_RDI->events,in_RDI->events_tail);
    if ((in_SIL & 1) != 0) {
      uVar2 = circ_array_next((_AL_VECTOR *)&local_8->any,in_stack_ffffffffffffffdc);
      in_RDI->events_tail = uVar2;
    }
  }
  return local_8;
}

Assistant:

static ALLEGRO_EVENT *get_next_event_if_any(ALLEGRO_EVENT_QUEUE *queue,
   bool delete)
{
   ALLEGRO_EVENT *event;

   if (is_event_queue_empty(queue)) {
      return NULL;
   }

   event = _al_vector_ref(&queue->events, queue->events_tail);
   if (delete) {
      queue->events_tail = circ_array_next(&queue->events, queue->events_tail);
   }
   return event;
}